

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_x87load(ASMState *as,IRRef ref)

{
  MCode *pMVar1;
  int32_t ofs;
  Reg rb;
  IRIns *pIVar2;
  IRIns *iri;
  cTValue *tv;
  IRIns *ir;
  IRRef ref_local;
  ASMState *as_local;
  
  pIVar2 = as->ir + ref;
  if ((pIVar2->field_1).o == '\x1c') {
    pIVar2 = pIVar2 + 1;
    if (*pIVar2 == (IRIns)0x0) {
      pMVar1 = as->mcp;
      pMVar1[-2] = 0xd9;
      pMVar1[-1] = 0xee;
      as->mcp = as->mcp + -2;
    }
    else if (*pIVar2 == (IRIns)0x3ff0000000000000) {
      pMVar1 = as->mcp;
      pMVar1[-2] = 0xd9;
      pMVar1[-1] = 0xe8;
      as->mcp = as->mcp + -2;
    }
    else {
      emit_rma(as,XO_FISTTPq,0,pIVar2);
    }
  }
  else if (((((pIVar2->field_1).o == '[') && ((pIVar2->field_0).op2 == 0x1d3)) &&
           (((pIVar2->field_1).r & 0x80) != 0)) &&
          ((((pIVar2->field_1).s == '\0' && (0x7fff < (pIVar2->field_0).op1)) &&
           (as->fuseref < (uint)(pIVar2->field_0).op1)))) {
    ofs = ra_spill(as,as->ir + (pIVar2->field_0).op1);
    emit_rmro(as,XO_FILDd,0,4,ofs);
  }
  else {
    rb = asm_fuseload(as,ref,0);
    emit_mrm(as,XO_FISTTPq,0,rb);
  }
  return;
}

Assistant:

static void asm_x87load(ASMState *as, IRRef ref)
{
  IRIns *ir = IR(ref);
  if (ir->o == IR_KNUM) {
    cTValue *tv = ir_knum(ir);
    if (tvispzero(tv))  /* Use fldz only for +0. */
      emit_x87op(as, XI_FLDZ);
    else if (tvispone(tv))
      emit_x87op(as, XI_FLD1);
    else
      emit_rma(as, XO_FLDq, XOg_FLDq, tv);
  } else if (ir->o == IR_CONV && ir->op2 == IRCONV_NUM_INT && !ra_used(ir) &&
	     !irref_isk(ir->op1) && mayfuse(as, ir->op1)) {
    IRIns *iri = IR(ir->op1);
    emit_rmro(as, XO_FILDd, XOg_FILDd, RID_ESP, ra_spill(as, iri));
  } else {
    emit_mrm(as, XO_FLDq, XOg_FLDq, asm_fuseload(as, ref, RSET_EMPTY));
  }
}